

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.hpp
# Opt level: O2

void __thiscall nite::FileTransfer::FTSession::FTSession(FTSession *this)

{
  uint64_t uVar1;
  anon_class_1_0_00000001 local_31;
  
  IP_Port::IP_Port(&this->ip);
  IndexedFile::IndexedFile(&this->indexed);
  (this->callback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->callback)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->callback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->callback).super__Function_base._M_functor + 8) = 0;
  (this->id)._M_dataplus._M_p = (pointer)&(this->id).field_2;
  (this->id)._M_string_length = 0;
  (this->id).field_2._M_local_buf[0] = '\0';
  this->index = 0;
  this->file = (FILE *)0x0;
  uVar1 = getTicks();
  this->lastResend = uVar1;
  std::function<void(nite::IndexedFile_const&,bool)>::operator=
            ((function<void(nite::IndexedFile_const&,bool)> *)&this->callback,&local_31);
  uVar1 = getTicks();
  this->lastPing = uVar1;
  return;
}

Assistant:

FTSession(){
					index = 0;
					file = NULL;
					lastResend = nite::getTicks();
					callback = [](const nite::IndexedFile &file, bool success){
						
					};
					ping();
				}